

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

string * cmsys::SystemTools::UnCapitalizedWords(string *__return_storage_ptr__,string *s)

{
  pointer pcVar1;
  int iVar2;
  int __c;
  size_t i;
  ulong uVar3;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  uVar3 = 0;
  do {
    if (s->_M_string_length <= uVar3) {
      return __return_storage_ptr__;
    }
    pcVar1 = (s->_M_dataplus)._M_p;
    __c = (int)pcVar1[uVar3];
    iVar2 = isalpha(__c);
    if (iVar2 != 0) {
      if (uVar3 != 0) {
        iVar2 = isspace((int)pcVar1[uVar3 - 1]);
        if (iVar2 == 0) goto LAB_0046167f;
      }
      iVar2 = tolower(__c);
      (__return_storage_ptr__->_M_dataplus)._M_p[uVar3] = (char)iVar2;
    }
LAB_0046167f:
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

kwsys_stl::string SystemTools::UnCapitalizedWords(const kwsys_stl::string& s)
{
  kwsys_stl::string n(s);
  for (size_t i = 0; i < s.size(); i++)
    {
#if defined(_MSC_VER) && defined (_MT) && defined (_DEBUG)
    // MS has an assert that will fail if s[i] < 0; setting
    // LC_CTYPE using setlocale() does *not* help. Painful.
    if ((int)s[i] >= 0 && isalpha(s[i]) &&
        (i == 0 || ((int)s[i - 1] >= 0 && isspace(s[i - 1]))))
#else
    if (isalpha(s[i]) && (i == 0 || isspace(s[i - 1])))
#endif
      {
      n[i] = static_cast<kwsys_stl::string::value_type>(tolower(s[i]));
      }
    }
  return n;
}